

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void script_tests::sign_invalid_miniscript_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  sign_invalid_miniscript t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1f8;
  std_string *in_stack_fffffffffffff200;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff208;
  const_string *in_stack_fffffffffffff220;
  const_string *msg;
  size_t in_stack_fffffffffffff228;
  size_t line_num;
  const_string *in_stack_fffffffffffff230;
  unit_test_log_t *in_stack_fffffffffffff238;
  sign_invalid_miniscript *in_stack_fffffffffffff248;
  const_string local_c38 [25];
  undefined1 local_aa0 [408];
  undefined1 local_908 [408];
  undefined1 local_770 [1488];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [24])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  sign_invalid_miniscript::sign_invalid_miniscript
            ((sign_invalid_miniscript *)in_stack_fffffffffffff1f8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [24])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [16])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::setup_conditional<script_tests::sign_invalid_miniscript>
            ((sign_invalid_miniscript *)0xa5a390);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [24])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [13])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  sign_invalid_miniscript::test_method(in_stack_fffffffffffff248);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_aa0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [24])in_stack_fffffffffffff200);
  this = boost::operator<<(in_stack_fffffffffffff208,(char (*) [19])in_stack_fffffffffffff200);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::teardown_conditional<script_tests::sign_invalid_miniscript>
            ((sign_invalid_miniscript *)0xa5a5b6);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  msg = local_c38;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [24])in_stack_fffffffffffff200);
  this_00 = boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  sign_invalid_miniscript::~sign_invalid_miniscript
            ((sign_invalid_miniscript *)in_stack_fffffffffffff1f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_invalid_miniscript)
{
    FillableSigningProvider keystore;
    SignatureData sig_data;
    CMutableTransaction prev, curr;

    // Create a Taproot output which contains a leaf in which a non-32 bytes push is used where a public key is expected
    // by the Miniscript parser. This offending Script was found by the RPC fuzzer.
    const auto invalid_pubkey{"173d36c8c9c9c9ffffffffffff0200000000021e1e37373721361818181818181e1e1e1e19000000000000000000b19292929292926b006c9b9b9292"_hex_u8};
    TaprootBuilder builder;
    builder.Add(0, {invalid_pubkey}, 0xc0);
    builder.Finalize(XOnlyPubKey::NUMS_H);
    prev.vout.emplace_back(0, GetScriptForDestination(builder.GetOutput()));
    curr.vin.emplace_back(COutPoint{prev.GetHash(), 0});
    sig_data.tr_spenddata = builder.GetSpendData();

    // SignSignature can fail but it shouldn't raise an exception (nor crash).
    BOOST_CHECK(!SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data));
}